

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::type_name(string *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(this->m_type) {
  case null:
    __s = "null";
    __a = &local_9;
    break;
  case object:
    __s = "object";
    __a = &local_a;
    break;
  case array:
    __s = "array";
    __a = &local_b;
    break;
  case string:
    __s = "string";
    __a = &local_c;
    break;
  case boolean:
    __s = "boolean";
    __a = &local_d;
    break;
  default:
    __s = "number";
    __a = &local_f;
    break;
  case discarded:
    __s = "discarded";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const
		{
			{
				switch (m_type)
				{
				case value_t::null:
					return "null";
				case value_t::object:
					return "object";
				case value_t::array:
					return "array";
				case value_t::string:
					return "string";
				case value_t::boolean:
					return "boolean";
				case value_t::discarded:
					return "discarded";
				default:
					return "number";
				}
			}
		}